

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::ArrayPtr<const_unsigned_char>_&> __thiscall
kj::Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>::
find<0ul,kj::ArrayPtr<unsigned_char_const>&>
          (Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>> *this,
          ArrayPtr<const_unsigned_char> *params)

{
  Maybe<kj::ArrayPtr<const_unsigned_char>_&> MVar1;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table;
  char local_20;
  size_t local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (ArrayPtr<const_unsigned_char> *)(this + 0x20);
  HashIndex<kj::_::HashSetCallbacks>::
  find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
            ((HashIndex<kj::_::HashSetCallbacks> *)&stack0xffffffffffffffe0,table,
             (ArrayPtr<const_unsigned_char> *)((long)(*(long *)(this + 8) - *(size_t *)this) >> 4));
  MVar1.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
  if (local_20 != '\0') {
    MVar1.ptr = (ArrayPtr<const_unsigned_char> *)(local_18 * 0x10 + *(long *)this);
  }
  return (Maybe<kj::ArrayPtr<const_unsigned_char>_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}